

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.cpp
# Opt level: O2

string * __thiscall
SchemeVector::external_repr_abi_cxx11_(string *__return_storage_ptr__,SchemeVector *this)

{
  shared_ptr<SchemePair> sVar1;
  undefined1 local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  sVar1 = to_list((SchemeVector *)local_40);
  (**(code **)(*(_func_int **)local_40._0_8_ + 0x10))
            (local_40 + 0x10,local_40._0_8_,
             sVar1.super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
             _M_pi);
  std::operator+(__return_storage_ptr__,"#",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_40 + 0x10));
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string SchemeVector::external_repr() const
{
    return "#" + to_list()->external_repr();
}